

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall clinet::send_message(clinet *this,int msgid,void *body,int len)

{
  long local_48;
  iobuf bufs [2];
  int len_local;
  void *body_local;
  clinet *pcStack_10;
  int msgid_local;
  clinet *this_local;
  
  local_48 = (long)&body_local + 4;
  bufs[0].data._0_4_ = 4;
  bufs[0]._8_8_ = body;
  bufs[1].data._0_4_ = len;
  bufs[1]._12_4_ = len;
  body_local._4_4_ = msgid;
  pcStack_10 = this;
  (*this->network_->_vptr_inetwork[4])(this->network_,(ulong)(uint)this->netid_,&local_48,2);
  return;
}

Assistant:

void send_message(int msgid, void* body, int len)
    {
        iobuf bufs[2];
        bufs[0].data = &msgid;
        bufs[0].len = sizeof(msgid);
        bufs[1].data = body;
        bufs[1].len = len;
        network_->sendv(netid_, bufs, 2);
    }